

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O2

BOOL GetUnicodeData(INT nUnicodeValue,UnicodeDataRec *pDataRec)

{
  UnicodeDataRec *pUVar1;
  undefined1 local_14 [8];
  INT nUnicodeValue_local;
  
  if ((uint)nUnicodeValue < 0x101) {
    pUVar1 = UnicodeData + nUnicodeValue;
  }
  else {
    pUVar1 = (UnicodeDataRec *)bsearch(local_14,UnicodeData,0x71b,8,UnicodeDataComp);
    if (pUVar1 == (UnicodeDataRec *)0x0) {
      return 0;
    }
  }
  *pDataRec = *pUVar1;
  return 1;
}

Assistant:

BOOL GetUnicodeData(INT nUnicodeValue, UnicodeDataRec *pDataRec)
{
    BOOL bRet;
    if (nUnicodeValue <= UNICODE_DATA_DIRECT_ACCESS)
    {
        *pDataRec = UnicodeData[nUnicodeValue];
        bRet = TRUE;
    }
    else
    {
        UnicodeDataRec *dataRec;
        INT nNumOfChars = UNICODE_DATA_SIZE;
        dataRec = (UnicodeDataRec *) bsearch(&nUnicodeValue, UnicodeData, nNumOfChars,
                       sizeof(UnicodeDataRec), UnicodeDataComp);
        if (dataRec == NULL)
        {
            bRet = FALSE;
        }
        else
        {
            bRet = TRUE;
            *pDataRec = *dataRec;
        }
    }
    return bRet;
}